

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  char cVar1;
  pointer pbVar2;
  pointer pcVar3;
  text *ptVar4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  runtime_error *this;
  long *plVar8;
  long *plVar9;
  _Alloc_hider _Var10;
  undefined1 uVar11;
  bool bVar12;
  undefined1 uVar13;
  pointer __rhs;
  undefined1 uVar14;
  text val;
  text opt;
  texts in;
  int local_1fc;
  bool local_1f8;
  bool local_1f0;
  bool local_1e8;
  bool local_1e0;
  bool local_1d8;
  bool local_1d0;
  bool local_1c8;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  ulong local_1a0;
  seed_t local_198;
  char *local_190;
  undefined8 local_188;
  char local_180;
  undefined7 uStack_17f;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  text local_158;
  text local_138;
  text local_118;
  text local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8 [2];
  long local_a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  text local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs == pbVar2) {
    local_1fc = 1;
    local_1f0 = false;
    bVar12 = false;
    bVar5 = false;
    uVar13 = false;
    uVar11 = false;
    local_1f8 = false;
    uVar14 = false;
    local_198 = 0;
    local_1e0 = false;
    local_1e8 = false;
    local_1d8 = false;
    local_1d0 = false;
    local_1c8 = false;
  }
  else {
    local_1fc = 1;
    bVar12 = true;
    local_1c8 = false;
    local_1d0 = false;
    local_1d8 = false;
    local_1e8 = false;
    local_1e0 = false;
    local_198 = 0;
    local_160 = 0;
    local_1f8 = false;
    local_170 = 0;
    local_168 = 0;
    bVar5 = false;
    local_1a0 = 0;
    local_1f0 = false;
    local_78 = __return_storage_ptr__;
    do {
      if (bVar12) {
        local_190 = &local_180;
        local_188 = 0;
        local_180 = '\0';
        local_1c0 = &local_1b0;
        local_1b8 = 0;
        local_1b0 = 0;
        pcVar3 = (__rhs->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + __rhs->_M_string_length);
        split_option((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,&local_70);
        std::__cxx11::string::operator=((string *)&local_190,(string *)local_b8);
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_d8);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        cVar1 = *local_190;
        if (cVar1 == '-') {
          iVar6 = std::__cxx11::string::compare((char *)&local_190);
          if (iVar6 == 0) goto LAB_00110e6a;
          iVar6 = std::__cxx11::string::compare((char *)&local_190);
          if (iVar6 == 0) {
LAB_00110e6f:
            local_1c8 = true;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&local_190);
            if (iVar6 == 0) goto LAB_00110e6f;
            iVar6 = std::__cxx11::string::compare((char *)&local_190);
            if (iVar6 == 0) {
LAB_00110e78:
              local_1d0 = true;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&local_190);
              if (iVar6 == 0) goto LAB_00110e78;
              iVar6 = std::__cxx11::string::compare((char *)&local_190);
              if (iVar6 == 0) {
LAB_00110e81:
                local_1d8 = true;
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)&local_190);
                if (iVar6 == 0) goto LAB_00110e81;
                iVar6 = std::__cxx11::string::compare((char *)&local_190);
                if (iVar6 == 0) {
LAB_00110e8a:
                  local_1e0 = true;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)&local_190);
                  if (iVar6 == 0) goto LAB_00110e8a;
                  iVar6 = std::__cxx11::string::compare((char *)&local_190);
                  if (iVar6 == 0) {
LAB_00110e93:
                    local_1e8 = true;
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)&local_190);
                    if (iVar6 == 0) goto LAB_00110e93;
                    iVar6 = std::__cxx11::string::compare((char *)&local_190);
                    if (iVar6 == 0) {
LAB_00110e9c:
                      local_1f0 = true;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)&local_190);
                      if (iVar6 == 0) goto LAB_00110e9c;
                      uVar7 = std::__cxx11::string::compare((char *)&local_190);
                      if ((int)uVar7 == 0) {
LAB_00110ea5:
                        local_1a0 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
                      }
                      else {
                        uVar7 = std::__cxx11::string::compare((char *)&local_190);
                        if ((int)uVar7 == 0) goto LAB_00110ea5;
                        iVar6 = std::__cxx11::string::compare((char *)&local_190);
                        if (iVar6 == 0) {
LAB_00110eae:
                          bVar5 = true;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)&local_190);
                          if (iVar6 == 0) goto LAB_00110eae;
                          iVar6 = std::__cxx11::string::compare((char *)&local_190);
                          if (iVar6 == 0) {
LAB_00110eb6:
                            local_1f8 = true;
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)&local_190);
                            if (iVar6 == 0) goto LAB_00110eb6;
                            uVar7 = std::__cxx11::string::compare((char *)&local_190);
                            if ((int)uVar7 == 0) {
                              local_160 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare((char *)&local_190);
                              if (iVar6 == 0) {
                                iVar6 = std::__cxx11::string::compare((char *)&local_1c0);
                                if (iVar6 == 0) goto LAB_00110ebd;
                              }
                              iVar6 = std::__cxx11::string::compare((char *)&local_190);
                              if (iVar6 == 0) {
                                uVar7 = std::__cxx11::string::compare((char *)&local_1c0);
                                if ((int)uVar7 == 0) {
                                  local_168 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
                                  goto LAB_00110ebd;
                                }
                              }
                              iVar6 = std::__cxx11::string::compare((char *)&local_190);
                              if (iVar6 == 0) {
                                uVar7 = std::__cxx11::string::compare((char *)&local_1c0);
                                if ((int)uVar7 == 0) {
                                  local_170 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
                                  goto LAB_00110ebd;
                                }
                              }
                              iVar6 = std::__cxx11::string::compare((char *)&local_190);
                              if (iVar6 == 0) {
                                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_f8,"--random-seed","");
                                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_118,local_1c0,local_1c0 + local_1b8);
                                local_198 = seed(&local_f8,&local_118);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                                  operator_delete(local_118._M_dataplus._M_p,
                                                  local_118.field_2._M_allocated_capacity + 1);
                                }
                                ptVar4 = &local_f8;
                                _Var10._M_p = local_f8._M_dataplus._M_p;
                              }
                              else {
                                iVar6 = std::__cxx11::string::compare((char *)&local_190);
                                if (iVar6 != 0) {
                                  this = (runtime_error *)__cxa_allocate_exception(0x10);
                                  std::operator+(&local_50,"unrecognised option \'",__rhs);
                                  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
                                  local_d8 = (long *)*plVar8;
                                  plVar9 = plVar8 + 2;
                                  if (local_d8 == plVar9) {
                                    local_c8 = *plVar9;
                                    lStack_c0 = plVar8[3];
                                    local_d8 = &local_c8;
                                  }
                                  else {
                                    local_c8 = *plVar9;
                                  }
                                  local_d0 = plVar8[1];
                                  *plVar8 = (long)plVar9;
                                  plVar8[1] = 0;
                                  *(undefined1 *)(plVar8 + 2) = 0;
                                  std::runtime_error::runtime_error(this,(string *)&local_d8);
                                  __cxa_throw(this,&std::runtime_error::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_138,"--repeat","");
                                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_158,local_1c0,local_1c0 + local_1b8);
                                local_1fc = repeat(&local_138,&local_158);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                                  operator_delete(local_158._M_dataplus._M_p,
                                                  local_158.field_2._M_allocated_capacity + 1);
                                }
                                ptVar4 = &local_138;
                                _Var10._M_p = local_138._M_dataplus._M_p;
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)_Var10._M_p != &ptVar4->field_2) {
                                operator_delete(_Var10._M_p,
                                                (ptVar4->field_2)._M_allocated_capacity + 1);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
LAB_00110e6a:
          bVar12 = false;
        }
LAB_00110ebd:
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
        }
        if (cVar1 != '-') goto LAB_00110f14;
      }
      else {
LAB_00110f14:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_98,__rhs);
      }
      __rhs = __rhs + 1;
    } while (__rhs != pbVar2);
    bVar12 = true;
    if ((local_1a0 & 1) == 0) {
      bVar12 = bVar5;
    }
    uVar14 = (undefined1)local_160;
    uVar11 = (undefined1)local_170;
    uVar13 = (undefined1)local_168;
    __return_storage_ptr__ = local_78;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__return_storage_ptr__,&local_98);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.help = local_1c8;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.abort = local_1d0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.count = local_1d8;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.list = local_1e8;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.tags = local_1e0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.time = local_1f0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.pass = bVar12;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.zen = bVar5;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.lexical = (bool)uVar13;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.random = (bool)uVar11;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.verbose = local_1f8;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.version = (bool)uVar14;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.repeat = local_1fc;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.seed = local_198;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

inline auto split_arguments( texts args ) -> std::tuple<options, texts>
{
    options option; texts in;

    bool in_options = true;

    for ( auto & arg : args )
    {
        if ( in_options )
        {
            text opt, val;
            std::tie( opt, val ) = split_option( arg );

            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + arg + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_tuple( option, in );
}